

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O0

void __thiscall
QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>::reset
          (QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate> *this,
          QDnsTlsAssociationRecordPrivate *ptr)

{
  bool bVar1;
  QDnsTlsAssociationRecordPrivate *this_00;
  QDnsTlsAssociationRecordPrivate *in_RSI;
  long in_FS_OFFSET;
  QDnsTlsAssociationRecordPrivate *old;
  totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*> *in_stack_ffffffffffffffb8;
  QDnsTlsAssociationRecordPrivate **in_stack_ffffffffffffffc0;
  totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*> local_20;
  totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*> local_18;
  QDnsTlsAssociationRecordPrivate *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_RSI;
  bVar1 = Qt::operator!=<QDnsTlsAssociationRecordPrivate_*,_true>
                    (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (bVar1) {
    if (local_10 != (QDnsTlsAssociationRecordPrivate *)0x0) {
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x3590ef);
    }
    Qt::totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>::totally_ordered_wrapper
              (&local_20,local_10);
    local_18 = std::
               exchange<Qt::totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate*>,Qt::totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate*>>
                         (in_stack_ffffffffffffffb8,
                          (totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*> *)0x35910d);
    this_00 = Qt::totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>::get(&local_18);
    if (((this_00 != (QDnsTlsAssociationRecordPrivate *)0x0) &&
        (bVar1 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x359133), !bVar1)) &&
       (this_00 != (QDnsTlsAssociationRecordPrivate *)0x0)) {
      QDnsTlsAssociationRecordPrivate::~QDnsTlsAssociationRecordPrivate(this_00);
      operator_delete(this_00,0x40);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void reset(T *ptr = nullptr) noexcept
    {
        if (ptr != d) {
            if (ptr)
                ptr->ref.ref();
            T *old = std::exchange(d, Qt::totally_ordered_wrapper(ptr)).get();
            if (old && !old->ref.deref())
                delete old;
        }
    }